

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

void __thiscall pstore::serialize::flood<_1l>(serialize *this,span<unsigned_char,__1L> sp)

{
  value_type_conflict vVar1;
  long lVar2;
  reference ptVar3;
  const_reference pvVar4;
  size_type __n;
  int iVar5;
  iterator it;
  iterator end;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_40;
  span<unsigned_char,__1L> sp_local;
  
  sp_local.storage_.data_ = (pointer)sp.storage_.super_extent_type<_1L>.size_;
  sp_local.storage_.super_extent_type<_1L>.size_ = (index_type)this;
  gsl::span<unsigned_char,_-1L>::begin((span<unsigned_char,__1L> *)&it);
  gsl::span<unsigned_char,_-1L>::end((span<unsigned_char,__1L> *)&end);
  for (lVar2 = sp_local.storage_.super_extent_type<_1L>.size_ / 4; 0 < lVar2; lVar2 = lVar2 + -1) {
    iVar5 = (int)&it;
    gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator++
              (&local_40,iVar5);
    ptVar3 = gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator*
                       (&local_40);
    *ptVar3 = 0xde;
    gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator++
              (&local_40,iVar5);
    ptVar3 = gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator*
                       (&local_40);
    *ptVar3 = 0xad;
    gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator++
              (&local_40,iVar5);
    ptVar3 = gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator*
                       (&local_40);
    *ptVar3 = 0xbe;
    gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator++
              (&local_40,iVar5);
    ptVar3 = gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator*
                       (&local_40);
    *ptVar3 = 0xef;
  }
  __n = 0;
  while ((it.span_ != end.span_ || (it.index_ != end.index_))) {
    pvVar4 = std::array<unsigned_char,_4UL>::at(&flood<-1L>::deadbeef,__n);
    vVar1 = *pvVar4;
    ptVar3 = gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator*
                       (&it);
    *ptVar3 = vVar1;
    __n = (size_type)((int)__n + 1U & 3);
    gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::operator++(&it);
  }
  return;
}

Assistant:

void flood (gsl::span<std::uint8_t, SpanExtent> sp) noexcept {
            static std::array<std::uint8_t, 4> const deadbeef{{0xDE, 0xAD, 0xBE, 0xEF}};

            auto it = std::begin (sp);
            auto end = std::end (sp);

            for (auto uint32_count = sp.size () / 4U; uint32_count > 0U; --uint32_count) {
                *(it++) = deadbeef[0];
                *(it++) = deadbeef[1];
                *(it++) = deadbeef[2];
                *(it++) = deadbeef[3];
            }

            auto index = std::size_t{0};
            for (; it != end; ++it) {
                *it = deadbeef.at (index);
                index = (index + 1) % deadbeef.size ();
            }
        }